

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  size_t local_b0;
  char *local_a8;
  size_t local_98;
  size_t n;
  char *oldPath;
  char *comp;
  size_t compLen;
  char *str;
  size_t dirAlloc;
  char *curPos;
  size_t dirlen;
  size_t pathLen;
  char *rawPath;
  char *pcStack_40;
  CURLcode result;
  char *fileName;
  char *slashPos;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  Curl_easy *data_local;
  
  conn = (connectdata *)(data->req).p.file;
  ftpc = (ftp_conn *)data->conn;
  slashPos = (char *)&((connectdata *)ftpc)->proto;
  fileName = (char *)0x0;
  pcStack_40 = (char *)0x0;
  rawPath._4_4_ = 0;
  pathLen = 0;
  dirlen = 0;
  *(byte *)((long)&((connectdata *)ftpc)->proto + 0x112) =
       *(byte *)((long)&((connectdata *)ftpc)->proto + 0x112) & 0xfb;
  *(byte *)((long)&((connectdata *)ftpc)->proto + 0x112) =
       *(byte *)((long)&((connectdata *)ftpc)->proto + 0x112) & 0xef;
  ftp = (FTP *)data;
  rawPath._4_4_ =
       Curl_urldecode((char *)(conn->cpool_node)._list,0,(char **)&pathLen,&dirlen,REJECT_CTRL);
  if (rawPath._4_4_ != CURLE_OK) {
    Curl_failf((Curl_easy *)ftp,"path contains control characters");
    return rawPath._4_4_;
  }
  cVar1 = *(char *)&ftp[0x39].pathalloc;
  if (cVar1 != '\x01') {
    if (cVar1 == '\x02') {
      if ((dirlen != 0) && (*(char *)(pathLen + (dirlen - 1)) != '/')) {
        pcStack_40 = (char *)pathLen;
      }
      goto LAB_00140c93;
    }
    if (cVar1 == '\x03') {
      fileName = strrchr((char *)pathLen,0x2f);
      if (fileName == (char *)0x0) {
        pcStack_40 = (char *)pathLen;
      }
      else {
        curPos = fileName + -pathLen;
        if (curPos == (char *)0x0) {
          curPos = (char *)0x1;
        }
        pvVar4 = (*Curl_ccalloc)(1,8);
        *(void **)(slashPos + 0xc0) = pvVar4;
        if (*(long *)(slashPos + 0xc0) == 0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        pvVar4 = Curl_memdup0((char *)pathLen,(size_t)curPos);
        **(undefined8 **)(slashPos + 0xc0) = pvVar4;
        if (**(long **)(slashPos + 0xc0) == 0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        slashPos[0xf8] = '\x01';
        slashPos[0xf9] = '\0';
        slashPos[0xfa] = '\0';
        slashPos[0xfb] = '\0';
        pcStack_40 = fileName + 1;
      }
      goto LAB_00140c93;
    }
  }
  dirAlloc = pathLen;
  str = (char *)0x0;
  for (compLen = pathLen; *(char *)compLen != '\0'; compLen = compLen + 1) {
    if (*(char *)compLen == '/') {
      str = str + 1;
    }
  }
  if (str != (char *)0x0) {
    pvVar4 = (*Curl_ccalloc)((size_t)str,8);
    *(void **)(slashPos + 0xc0) = pvVar4;
    if (*(long *)(slashPos + 0xc0) == 0) {
      (*Curl_cfree)((void *)pathLen);
      return CURLE_OUT_OF_MEMORY;
    }
    while (fileName = strchr((char *)dirAlloc,0x2f), fileName != (char *)0x0) {
      comp = fileName + -dirAlloc;
      if ((comp == (char *)0x0) && (*(int *)(slashPos + 0xf8) == 0)) {
        comp = (char *)0x1;
      }
      if (comp != (char *)0x0) {
        pvVar4 = Curl_memdup0((char *)dirAlloc,(size_t)comp);
        if (pvVar4 == (void *)0x0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        iVar3 = *(int *)(slashPos + 0xf8);
        *(int *)(slashPos + 0xf8) = iVar3 + 1;
        *(void **)(*(long *)(slashPos + 0xc0) + (long)iVar3 * 8) = pvVar4;
      }
      dirAlloc = (size_t)(fileName + 1);
    }
    fileName = (char *)0x0;
  }
  pcStack_40 = (char *)dirAlloc;
LAB_00140c93:
  if ((pcStack_40 == (char *)0x0) || (*pcStack_40 == '\0')) {
    slashPos[0xb8] = '\0';
    slashPos[0xb9] = '\0';
    slashPos[0xba] = '\0';
    slashPos[0xbb] = '\0';
    slashPos[0xbc] = '\0';
    slashPos[0xbd] = '\0';
    slashPos[0xbe] = '\0';
    slashPos[0xbf] = '\0';
  }
  else {
    pcVar5 = (*Curl_cstrdup)(pcStack_40);
    *(char **)(slashPos + 0xb8) = pcVar5;
  }
  sVar2 = dirlen;
  if ((((*(uint *)&ftp[0x9e].field_0x14 >> 0x11 & 1) == 0) || (*(long *)(slashPos + 0xb8) != 0)) ||
     (*(int *)&(conn->cpool_node)._prev != 0)) {
    slashPos[0x112] = slashPos[0x112] & 0xf7;
    if ((*(char *)&ftp[0x39].pathalloc == '\x02') && (*(char *)pathLen == '/')) {
      slashPos[0x112] = slashPos[0x112] & 0xf7U | 8;
    }
    else {
      if ((ftpc[3].pp.recvbuf.allc >> 6 & 1) == 0) {
        local_a8 = "";
      }
      else {
        local_a8 = *(char **)(slashPos + 0xd0);
      }
      if (local_a8 != (char *)0x0) {
        if (*(char *)&ftp[0x39].pathalloc == '\x02') {
          local_98 = 0;
        }
        else {
          if (*(long *)(slashPos + 0xb8) == 0) {
            local_b0 = 0;
          }
          else {
            local_b0 = strlen(*(char **)(slashPos + 0xb8));
          }
          local_98 = sVar2 - local_b0;
        }
        sVar6 = strlen(local_a8);
        if ((sVar6 == local_98) && (iVar3 = strncmp((char *)pathLen,local_a8,local_98), iVar3 == 0))
        {
          if (((ftp != (FTP *)0x0) &&
              ((*(ulong *)((long)&ftp[0x54].downloadsize + 2) >> 0x1c & 1) != 0)) &&
             ((ftp[0x99].pathalloc == (char *)0x0 || (0 < *(int *)(ftp[0x99].pathalloc + 8))))) {
            Curl_infof((Curl_easy *)ftp,"Request has same path as previous transfer");
          }
          slashPos[0x112] = slashPos[0x112] & 0xf7U | 8;
        }
      }
    }
    (*Curl_cfree)((void *)pathLen);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf((Curl_easy *)ftp,"Uploading to a URL without a filename");
    (*Curl_cfree)((void *)pathLen);
    data_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  return data_local._4_4_;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
        fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
          dirlen = 1;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = Curl_memdup0(rawPath, dirlen);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is filename */
      }
      else
        fileName = rawPath; /* filename only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      /* number of entries allocated for the 'dirs' array */
      size_t dirAlloc = 0;
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if(*str == '/')
          ++dirAlloc;

      if(dirAlloc) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) does not
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = Curl_memdup0(curPos, compLen);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT((size_t)ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the filename (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->state.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a filename when uploading. Return error! */
    failf(data, "Uploading to a URL without a filename");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file ? strlen(ftpc->file) : 0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}